

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a3.cpp
# Opt level: O2

void __thiscall RasterizerA3<4U>::RasterizerA3(RasterizerA3<4U> *this,Image *dst,uint32_t options)

{
  CellRasterizer::CellRasterizer(&this->super_CellRasterizer,dst,options);
  (this->super_CellRasterizer).super_Rasterizer._vptr_Rasterizer =
       (_func_int **)&PTR__RasterizerA3_0012dc18;
  (this->_yBounds).start = 0;
  (this->_yBounds).end = 0;
  this->_bitStride = 0;
  this->_bits = (BitWord *)0x0;
  this->_cellStride = 0;
  this->_cells = (Cell *)0x0;
  snprintf((this->super_CellRasterizer).super_Rasterizer._name,0x20,"A3x%u",4);
  Rasterizer::addOptionsToName((Rasterizer *)this);
  init(this,(EVP_PKEY_CTX *)(ulong)(uint)dst->_width);
  return;
}

Assistant:

RasterizerA3<N>::RasterizerA3(Image& dst, uint32_t options) noexcept
  : CellRasterizer(dst, options),
    _yBounds { 0, 0 },
    _bitStride(0),
    _bits(nullptr),
    _cellStride(0),
    _cells(nullptr) {
  std::snprintf(_name, ARRAY_SIZE(_name), "A3x%u", kPixelsPerOneBit);
  addOptionsToName();
  init(dst.width(), dst.height());
}